

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDVertexEdgeProperties::HasInteriorVertexTopology(ON_SubDVertexEdgeProperties *this)

{
  bool local_11;
  ON_SubDVertexEdgeProperties *this_local;
  
  local_11 = false;
  if ((((this->m_null_edge_count == 0) &&
       (local_11 = false, this->m_edge_count == this->m_face_count)) &&
      (local_11 = false, this->m_boundary_edge_count == 0)) &&
     (local_11 = false, 1 < this->m_interior_edge_count)) {
    local_11 = this->m_nonmanifold_edge_count == 0;
  }
  return local_11;
}

Assistant:

bool ON_SubDVertexEdgeProperties::HasInteriorVertexTopology() const
{
  return 
    m_null_edge_count == 0
    && m_edge_count == m_face_count
    && m_boundary_edge_count == 0
    && m_interior_edge_count >= 2
    && m_nonmanifold_edge_count == 0
    ;
}